

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void M_SetMenu(FName *menu,int param)

{
  uint uVar1;
  FMenuDescriptor *pFVar2;
  Node *pNVar3;
  char *message;
  PClass *pPVar4;
  ClassReg *pCVar5;
  DMenu *menu_00;
  Node *pNVar6;
  FName *action;
  PClass *pPVar7;
  FOptionMenuDescriptor *ld;
  int iVar8;
  FName local_2c;
  FName local_28;
  FName local_24;
  FName local_20;
  FName local_1c;
  _func_int **local_18;
  
  switch(menu->Index) {
  case 0x1d6:
    GameStartupInfo.Episode = -1;
    GameStartupInfo.Skill = -1;
    if (param == -1000) {
      GameStartupInfo.PlayerClass = (char *)0x0;
    }
    else if (param == -1) {
      GameStartupInfo.PlayerClass = "Random";
    }
    else {
      GetPrintableDisplayName((PClassPlayerPawn *)&stack0xffffffffffffffe8);
      GameStartupInfo.PlayerClass = (char *)local_18;
      FString::~FString((FString *)&stack0xffffffffffffffe8);
    }
    break;
  case 0x1d9:
    if ((param < 1) || ((gameinfo.flags & 2U) == 0)) {
      GameStartupInfo.Episode = param;
      M_StartupSkillMenu(&GameStartupInfo);
      break;
    }
    message = FStringTable::operator()(&GStrings,"SWSTRING");
    action = &local_1c;
LAB_00336147:
    action->Index = 0;
    goto LAB_00336150;
  case 0x1da:
    GameStartupInfo.Skill = param;
  case 0x1dc:
    G_DeferedInitNew(&GameStartupInfo);
    if (gamestate == GS_FULLCONSOLE) {
      gamestate = GS_HIDECONSOLE;
      gameaction = ga_newgame;
    }
    M_ClearMenus();
    return;
  case 0x1db:
    GameStartupInfo.Skill = param;
    message = AllSkills.Array[param].MustConfirmText.Chars;
    if (*message == '\0') {
      message = FStringTable::operator()(&GStrings,"NIGHTMARE");
    }
    action = &local_20;
    local_20.Index = 0x1dc;
    iVar8 = 0;
    goto LAB_003361e1;
  case 0x1de:
    if ((!usergame) ||
       ((((int)(&DAT_00a60328)[(long)consoleplayer * 0xa8] < 1 && (!multiplayer)) ||
        (gamestate != GS_LEVEL)))) {
      message = FStringTable::operator()(&GStrings,"SAVEDEAD");
      action = &local_24;
      goto LAB_00336147;
    }
  }
  uVar1 = menu->Index;
  pNVar3 = MenuDescriptors.Nodes + (MenuDescriptors.Size - 1 & uVar1);
  do {
    pNVar6 = pNVar3;
    if ((pNVar6 == (Node *)0x0) || (pNVar6->Next == (Node *)0x1)) {
      local_2c.Index = uVar1;
      pPVar4 = PClass::FindClass(&local_2c);
      if (pPVar4 == (PClass *)0x0) goto LAB_00336324;
      pPVar7 = pPVar4;
      if (pPVar4 != DMenu::RegistrationInfo.MyClass) goto LAB_003362f6;
      goto LAB_0033630c;
    }
    pNVar3 = pNVar6->Next;
  } while ((pNVar6->Pair).Key.Index != uVar1);
  pFVar2 = (pNVar6->Pair).Value;
  message = (pFVar2->mNetgameMessage).Chars;
  if (((*(int *)(message + -0xc) != 0) && (netgame == true)) && (demoplayback == false)) {
    action = &local_28;
    local_28.Index = 0;
LAB_00336150:
    iVar8 = 1;
LAB_003361e1:
    M_StartMessage(message,iVar8,action);
    return;
  }
  if (pFVar2->mType == 1) {
    pPVar4 = pFVar2->mClass;
    if (pPVar4 == (PClass *)0x0) {
      pCVar5 = &DOptionMenu::RegistrationInfo;
      goto LAB_00336371;
    }
  }
  else {
    if (pFVar2->mType != 0) {
      return;
    }
    iVar8 = *(int *)&pFVar2[2].mNetgameMessage.Chars;
    if ((-1 < (long)iVar8) && (iVar8 < *(int *)&pFVar2[1].field_0xc)) {
      (**(code **)(*(long *)pFVar2[1]._vptr_FMenuDescriptor[iVar8] + 0x30))();
      return;
    }
    pPVar4 = pFVar2->mClass;
    if (pPVar4 == (PClass *)0x0) {
      pCVar5 = &DListMenu::RegistrationInfo;
LAB_00336371:
      pPVar4 = pCVar5->MyClass;
    }
  }
  menu_00 = (DMenu *)PClass::CreateNew(pPVar4);
  (*(menu_00->super_DObject)._vptr_DObject[0xf])(menu_00,DMenu::CurrentMenu,pFVar2);
LAB_00336392:
  M_ActivateMenu(menu_00);
  return;
  while (pPVar7 != (PClass *)0x0) {
LAB_003362f6:
    pPVar7 = pPVar7->ParentClass;
    if (pPVar7 == DMenu::RegistrationInfo.MyClass) break;
  }
  if (pPVar7 == (PClass *)0x0) {
LAB_00336324:
    Printf("Attempting to open menu of unknown type \'%s\'\n",
           FName::NameData.NameArray[menu->Index].Text);
    M_ClearMenus();
    return;
  }
LAB_0033630c:
  menu_00 = (DMenu *)PClass::CreateNew(pPVar4);
  (menu_00->mParentMenu).field_0.p = DMenu::CurrentMenu;
  goto LAB_00336392;
}

Assistant:

void M_SetMenu(FName menu, int param)
{
	// some menus need some special treatment
	switch (menu)
	{
	case NAME_Episodemenu:
		// sent from the player class menu
		GameStartupInfo.Skill = -1;
		GameStartupInfo.Episode = -1;
		GameStartupInfo.PlayerClass = 
			param == -1000? NULL :
			param == -1? "Random" : GetPrintableDisplayName(PlayerClasses[param].Type).GetChars();
		break;

	case NAME_Skillmenu:
		// sent from the episode menu

		if ((gameinfo.flags & GI_SHAREWARE) && param > 0)
		{
			// Only Doom and Heretic have multi-episode shareware versions.
			M_StartMessage(GStrings("SWSTRING"), 1);
			return;
		}

		GameStartupInfo.Episode = param;
		M_StartupSkillMenu(&GameStartupInfo);	// needs player class name from class menu (later)
		break;

	case NAME_StartgameConfirm:
	{
		// sent from the skill menu for a skill that needs to be confirmed
		GameStartupInfo.Skill = param;

		const char *msg = AllSkills[param].MustConfirmText;
		if (*msg==0) msg = GStrings("NIGHTMARE");
		M_StartMessage (msg, 0, NAME_StartgameConfirmed);
		return;
	}

	case NAME_Startgame:
		// sent either from skill menu or confirmation screen. Skill gets only set if sent from skill menu
		// Now we can finally start the game. Ugh...
		GameStartupInfo.Skill = param;
	case NAME_StartgameConfirmed:

		G_DeferedInitNew (&GameStartupInfo);
		if (gamestate == GS_FULLCONSOLE)
		{
			gamestate = GS_HIDECONSOLE;
			gameaction = ga_newgame;
		}
		M_ClearMenus ();
		return;

	case NAME_Savegamemenu:
		if (!usergame || (players[consoleplayer].health <= 0 && !multiplayer) || gamestate != GS_LEVEL)
		{
			// cannot save outside the game.
			M_StartMessage (GStrings("SAVEDEAD"), 1);
			return;
		}
	}

	// End of special checks

	FMenuDescriptor **desc = MenuDescriptors.CheckKey(menu);
	if (desc != NULL)
	{
		if ((*desc)->mNetgameMessage.IsNotEmpty() && netgame && !demoplayback)
		{
			M_StartMessage((*desc)->mNetgameMessage, 1);
			return;
		}

		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			if (ld->mAutoselect >= 0 && ld->mAutoselect < (int)ld->mItems.Size())
			{
				// recursively activate the autoselected item without ever creating this menu.
				ld->mItems[ld->mAutoselect]->Activate();
			}
			else
			{
				const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DListMenu) : ld->mClass;

				DListMenu *newmenu = (DListMenu *)cls->CreateNew();
				newmenu->Init(DMenu::CurrentMenu, ld);
				M_ActivateMenu(newmenu);
			}
		}
		else if ((*desc)->mType == MDESC_OptionsMenu)
		{
			FOptionMenuDescriptor *ld = static_cast<FOptionMenuDescriptor*>(*desc);
			const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DOptionMenu) : ld->mClass;

			DOptionMenu *newmenu = (DOptionMenu *)cls->CreateNew();
			newmenu->Init(DMenu::CurrentMenu, ld);
			M_ActivateMenu(newmenu);
		}
		return;
	}
	else
	{
		const PClass *menuclass = PClass::FindClass(menu);
		if (menuclass != NULL)
		{
			if (menuclass->IsDescendantOf(RUNTIME_CLASS(DMenu)))
			{
				DMenu *newmenu = (DMenu*)menuclass->CreateNew();
				newmenu->mParentMenu = DMenu::CurrentMenu;
				M_ActivateMenu(newmenu);
				return;
			}
		}
	}
	Printf("Attempting to open menu of unknown type '%s'\n", menu.GetChars());
	M_ClearMenus();
}